

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fttrigon.c
# Opt level: O0

FT_Fixed FT_Tan(FT_Angle angle)

{
  FT_Long FVar1;
  undefined1 local_20 [8];
  FT_Vector v;
  FT_Angle angle_local;
  
  local_20 = (undefined1  [8])0x1000000;
  v.x = 0;
  v.y = angle;
  ft_trig_pseudo_rotate((FT_Vector *)local_20,angle);
  FVar1 = FT_DivFix(v.x,(FT_Long)local_20);
  return FVar1;
}

Assistant:

FT_EXPORT_DEF( FT_Fixed )
  FT_Tan( FT_Angle  angle )
  {
    FT_Vector  v = { 1 << 24, 0 };


    ft_trig_pseudo_rotate( &v, angle );

    return FT_DivFix( v.y, v.x );
  }